

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,char **text,char *defaultValue)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = Node::get(this->node,key);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = defaultValue;
    if (defaultValue == (char *)0x0) {
      pcVar1 = (char *)0x0;
      pcVar2 = (char *)0x0;
      goto LAB_001c233a;
    }
  }
  else {
    pcVar2 = strchr(pcVar1,0x5c);
    if (pcVar2 != (char *)0x0) {
      pcVar1 = decodeText(pcVar1);
      *text = pcVar1;
      return '\x01';
    }
  }
  pcVar2 = strdup(pcVar1);
LAB_001c233a:
  *text = pcVar2;
  return pcVar1 != defaultValue;
}

Assistant:

char Fl_Preferences::get( const char *key, char *&text, const char *defaultValue ) {
  const char *v = node->get( key );
  if ( v && strchr( v, '\\' ) ) {
    text = decodeText( v );
    return 1;
  }
  if ( !v ) v = defaultValue;
  if ( v )
    text = strdup( v );
  else
    text = 0;
  return ( v != defaultValue );
}